

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O3

void duckdb_fastpforlib::internal::__fastpack11(uint64_t *in,uint32_t *out)

{
  uint64_t uVar1;
  
  uVar1 = in[2];
  *out = (uint)uVar1 << 0x16 | ((uint)in[1] & 0x7ff) << 0xb | (uint)*in & 0x7ff;
  out[1] = (uint)uVar1 >> 10 & 1;
  Unroller<(unsigned_short)11,_(unsigned_short)3>::Pack(in,out + 1);
  return;
}

Assistant:

void __fastpack11(const uint64_t *__restrict in, uint32_t *__restrict out) {
	Unroller<11>::Pack(in, out);
}